

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

bool Rml::InterpolateEffectProperties
               (PropertyDictionary *properties,EffectDeclarationView *d0,EffectDeclarationView *d1,
               float alpha,Element *element)

{
  PropertyId id_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PropertyMap *this;
  pointer ppVar5;
  PropertySpecification *this_00;
  PropertyMap *pPVar6;
  reference ppVar7;
  PropertyDefinition *this_01;
  Property *pPVar8;
  Property *local_200;
  Property *local_1f8;
  EffectDeclarationView *local_1f0;
  undefined1 local_1d8 [8];
  Property p_1;
  Property *p_interp1;
  Property *p_interp0;
  Property *p_default;
  Property *p_filled;
  PropertyDefinition *underlying_definition;
  PropertyId id_1;
  pair<Rml::PropertyId,_Rml::Property> *pair_filled;
  const_iterator __end3;
  const_iterator __begin3;
  PropertyMap *__range3;
  PropertyMap *properties_filled;
  PropertySpecification *specification;
  EffectDeclarationView *d_filled;
  undefined1 local_100 [8];
  Property p;
  Property *prop1;
  undefined1 local_98 [8];
  const_iterator it;
  Property *prop0;
  reference ppStack_78;
  PropertyId id;
  pair<Rml::PropertyId,_Rml::Property> *pair0;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  PropertyMap *properties1;
  PropertyMap *properties0;
  Element *element_local;
  float alpha_local;
  EffectDeclarationView *d1_local;
  EffectDeclarationView *d0_local;
  PropertyDictionary *properties_local;
  
  bVar2 = EffectDeclarationView::operator_cast_to_bool(d0);
  if ((bVar2) && (bVar2 = EffectDeclarationView::operator_cast_to_bool(d1), bVar2)) {
    if (((d0->instancer != (EffectSpecification *)0x0) && (d0->instancer == d1->instancer)) &&
       (bVar2 = ::std::operator!=(d0->type,d1->type), !bVar2)) {
      iVar3 = PropertyDictionary::GetNumProperties(d0->properties);
      iVar4 = PropertyDictionary::GetNumProperties(d1->properties);
      if ((iVar3 == iVar4) && (d0->paint_area == d1->paint_area)) {
        pPVar6 = PropertyDictionary::GetProperties(d0->properties);
        this = PropertyDictionary::GetProperties(d1->properties);
        join_0x00000010_0x00000000_ =
             robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::begin(pPVar6);
        _pair0 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::end(pPVar6);
        while( true ) {
          bVar2 = robin_hood::detail::
                  Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                  ::Iter<true>::operator!=((Iter<true> *)&__end2.mInfo,(Iter<true> *)&pair0);
          if (!bVar2) {
            return true;
          }
          ppStack_78 = robin_hood::detail::
                       Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                       ::Iter<true>::operator*((Iter<true> *)&__end2.mInfo);
          prop0._7_1_ = ppStack_78->first;
          it.mInfo = (uint8_t *)&ppStack_78->second;
          _local_98 = robin_hood::detail::
                      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                      ::find(this,(key_type *)((long)&prop0 + 7));
          _prop1 = robin_hood::detail::
                   Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   ::end(this);
          bVar2 = robin_hood::detail::
                  Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                  ::Iter<true>::operator==((Iter<true> *)local_98,(Iter<true> *)&prop1);
          if (bVar2) break;
          ppVar5 = robin_hood::detail::
                   Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   ::Iter<true>::operator->((Iter<true> *)local_98);
          p.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&ppVar5->second;
          InterpolateProperties
                    ((Property *)local_100,(Property *)it.mInfo,
                     (Property *)
                     p.source.
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,alpha,element,*(PropertyDefinition **)(it.mInfo + 0x30));
          p._40_8_ = *(undefined8 *)(it.mInfo + 0x30);
          PropertyDictionary::SetProperty(properties,prop0._7_1_,(Property *)local_100);
          Property::~Property((Property *)local_100);
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::Iter<true>::operator++((Iter<true> *)&__end2.mInfo);
        }
        bVar2 = Assert("Incompatible decorator properties.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                       ,0x9a);
        if (bVar2) {
          return false;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    properties_local._7_1_ = false;
  }
  else {
    bVar2 = EffectDeclarationView::operator_cast_to_bool(d0);
    if (((bVar2) && (bVar2 = EffectDeclarationView::operator_cast_to_bool(d1), !bVar2)) ||
       ((bVar2 = EffectDeclarationView::operator_cast_to_bool(d0), !bVar2 &&
        (bVar2 = EffectDeclarationView::operator_cast_to_bool(d1), bVar2)))) {
      bVar2 = EffectDeclarationView::operator_cast_to_bool(d0);
      local_1f0 = d0;
      if (!bVar2) {
        local_1f0 = d1;
      }
      this_00 = EffectSpecification::GetPropertySpecification(local_1f0->instancer);
      pPVar6 = PropertyDictionary::GetProperties(local_1f0->properties);
      join_0x00000010_0x00000000_ =
           robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::begin(pPVar6);
      _pair_filled = robin_hood::detail::
                     Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     ::end(pPVar6);
      while (bVar2 = robin_hood::detail::
                     Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                     ::Iter<true>::operator!=
                               ((Iter<true> *)&__end3.mInfo,(Iter<true> *)&pair_filled), bVar2) {
        ppVar7 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::Iter<true>::operator*((Iter<true> *)&__end3.mInfo);
        id_00 = ppVar7->first;
        this_01 = PropertySpecification::GetProperty(this_00,id_00);
        if (this_01 == (PropertyDefinition *)0x0) {
          return false;
        }
        local_200 = &ppVar7->second;
        pPVar8 = PropertyDefinition::GetDefaultValue(this_01);
        bVar2 = EffectDeclarationView::operator_cast_to_bool(d0);
        local_1f8 = local_200;
        if (!bVar2) {
          local_1f8 = pPVar8;
        }
        bVar2 = EffectDeclarationView::operator_cast_to_bool(d1);
        if (!bVar2) {
          local_200 = pPVar8;
        }
        p_1.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200;
        InterpolateProperties
                  ((Property *)local_1d8,local_1f8,local_200,alpha,element,
                   (ppVar7->second).definition);
        p_1._40_8_ = (ppVar7->second).definition;
        PropertyDictionary::SetProperty(properties,id_00,(Property *)local_1d8);
        Property::~Property((Property *)local_1d8);
        robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::Iter<true>::operator++((Iter<true> *)&__end3.mInfo);
      }
      properties_local._7_1_ = true;
    }
    else {
      properties_local._7_1_ = false;
    }
  }
  return properties_local._7_1_;
}

Assistant:

static bool InterpolateEffectProperties(PropertyDictionary& properties, const EffectDeclarationView& d0, const EffectDeclarationView& d1, float alpha,
	Element& element)
{
	if (d0 && d1)
	{
		// Both declarations are specified, check if they are compatible for interpolation.
		if (!d0.instancer || d0.instancer != d1.instancer || *d0.type != *d1.type ||
			d0.properties->GetNumProperties() != d1.properties->GetNumProperties() || d0.paint_area != d1.paint_area)
			return false;

		const auto& properties0 = d0.properties->GetProperties();
		const auto& properties1 = d1.properties->GetProperties();

		for (const auto& pair0 : properties0)
		{
			const PropertyId id = pair0.first;
			const Property& prop0 = pair0.second;

			auto it = properties1.find(id);
			if (it == properties1.end())
			{
				RMLUI_ERRORMSG("Incompatible decorator properties.");
				return false;
			}
			const Property& prop1 = it->second;

			Property p = InterpolateProperties(prop0, prop1, alpha, element, prop0.definition);
			p.definition = prop0.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}
	else if ((d0 && !d1) || (!d0 && d1))
	{
		// One of the declarations is empty, interpolate against the default values of its type.
		const auto& d_filled = (d0 ? d0 : d1);

		const PropertySpecification& specification = d_filled.instancer->GetPropertySpecification();
		const PropertyMap& properties_filled = d_filled.properties->GetProperties();

		for (const auto& pair_filled : properties_filled)
		{
			const PropertyId id = pair_filled.first;
			const PropertyDefinition* underlying_definition = specification.GetProperty(id);
			if (!underlying_definition)
				return false;

			const Property& p_filled = pair_filled.second;
			const Property& p_default = *underlying_definition->GetDefaultValue();
			const Property& p_interp0 = (d0 ? p_filled : p_default);
			const Property& p_interp1 = (d1 ? p_filled : p_default);

			Property p = InterpolateProperties(p_interp0, p_interp1, alpha, element, p_filled.definition);
			p.definition = p_filled.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}

	return false;
}